

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

bool_t NodeContext_Cleanup(nodecontext *p,bool_t Force)

{
  bool_t bVar1;
  nodecontext *Module;
  
  if (p->FreeModule == (_func_void_nodecontext_ptr_nodemodule_ptr *)0x0) {
    return 0;
  }
  bVar1 = 0;
  Module = p;
LAB_00116c04:
  do {
    Module = (nodecontext *)(Module->Base).Next;
    if (Module == (nodecontext *)0x0) {
      return bVar1;
    }
  } while ((Module->Base).Module == (void *)0x0);
  if (Force == 0) goto code_r0x00116c1b;
  goto LAB_00116c39;
code_r0x00116c1b:
  if (((Module->Base).Config == '\0') && ((Module->Base).Base.RefCount == 1)) {
    NodeSingletonEvent(p,10,(nodemodule *)Module);
LAB_00116c39:
    UnRegisterModule(p,(nodemodule *)Module,0);
    (*p->FreeModule)(p,(nodemodule *)Module);
    bVar1 = 1;
  }
  goto LAB_00116c04;
}

Assistant:

NOINLINE bool_t NodeContext_Cleanup(nodecontext* p,bool_t Force)
{
    // at the moment we only release modules without any object (not even singleton objects)
    // because cleanup and singleton object releasing could have multithreading issues...

    bool_t Found=0;
    if (p->FreeModule)
    {
        nodemodule* i;
        for (i=p->Base.Next;i;i=i->Next)
            if (i->Module && (Force || (!i->Config && i->Base.RefCount==1)))
            {
                if (!Force)
                    NodeSingletonEvent(p,NODE_SINGLETON_SHUTDOWN,i);
                UnRegisterModule(p,i,0);
                p->FreeModule(p,i);
                Found = 1;
            }
    }
    return Found;
}